

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscription.h
# Opt level: O0

int __thiscall
aeron::Subscription::
poll<std::function<void(aeron::concurrent::AtomicBuffer&,int,int,aeron::concurrent::logbuffer::Header&)>&>
          (Subscription *this,
          function<void_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
          *fragmentHandler,int fragmentLimit)

{
  ulong uVar1;
  Image *pIVar2;
  int iVar3;
  ImageList *pIVar4;
  ulong local_58;
  size_t i_1;
  size_t i;
  size_t startingIndex;
  int fragmentsRead;
  Image *images;
  size_t length;
  ImageList *imageList;
  int fragmentLimit_local;
  function<void_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
  *fragmentHandler_local;
  Subscription *this_local;
  
  pIVar4 = std::atomic_load_explicit<aeron::ImageList*>(&this->m_imageList,memory_order_acquire);
  uVar1 = pIVar4->m_length;
  pIVar2 = pIVar4->m_images;
  startingIndex._4_4_ = 0;
  i = this->m_roundRobinIndex;
  this->m_roundRobinIndex = i + 1;
  if (uVar1 <= i) {
    i = 0;
    this->m_roundRobinIndex = 0;
  }
  for (i_1 = i; i_1 < uVar1 && startingIndex._4_4_ < fragmentLimit; i_1 = i_1 + 1) {
    iVar3 = Image::
            poll<std::function<void(aeron::concurrent::AtomicBuffer&,int,int,aeron::concurrent::logbuffer::Header&)>&>
                      (pIVar2 + i_1,fragmentHandler,fragmentLimit - startingIndex._4_4_);
    startingIndex._4_4_ = iVar3 + startingIndex._4_4_;
  }
  for (local_58 = 0; local_58 < i && startingIndex._4_4_ < fragmentLimit; local_58 = local_58 + 1) {
    iVar3 = Image::
            poll<std::function<void(aeron::concurrent::AtomicBuffer&,int,int,aeron::concurrent::logbuffer::Header&)>&>
                      (pIVar2 + local_58,fragmentHandler,fragmentLimit - startingIndex._4_4_);
    startingIndex._4_4_ = iVar3 + startingIndex._4_4_;
  }
  return startingIndex._4_4_;
}

Assistant:

inline int poll(F&& fragmentHandler, int fragmentLimit)
    {
        const struct ImageList *imageList = std::atomic_load_explicit(&m_imageList, std::memory_order_acquire);
        const std::size_t length = imageList->m_length;
        Image *images = imageList->m_images;
        int fragmentsRead = 0;

        std::size_t startingIndex = m_roundRobinIndex++;
        if (startingIndex >= length)
        {
            m_roundRobinIndex = startingIndex = 0;
        }

        for (std::size_t i = startingIndex; i < length && fragmentsRead < fragmentLimit; i++)
        {
            fragmentsRead += images[i].poll(fragmentHandler, fragmentLimit - fragmentsRead);
        }

        for (std::size_t i = 0; i < startingIndex && fragmentsRead < fragmentLimit; i++)
        {
            fragmentsRead += images[i].poll(fragmentHandler, fragmentLimit - fragmentsRead);
        }

        return fragmentsRead;
    }